

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cpp
# Opt level: O2

int duckdb_brotli::BrotliDecoderIsFinished(BrotliDecoderStateInternal *s)

{
  uint uVar1;
  
  uVar1 = 0;
  if (s->state == BROTLI_STATE_DONE) {
    uVar1 = BrotliDecoderHasMoreOutput(s);
    uVar1 = uVar1 ^ 1;
  }
  return uVar1;
}

Assistant:

BROTLI_BOOL BrotliDecoderIsFinished(const BrotliDecoderState *s) {
	return TO_BROTLI_BOOL(s->state == BROTLI_STATE_DONE) && !BrotliDecoderHasMoreOutput(s);
}